

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

BuiltinFunction Js::JavascriptLibrary::GetBuiltInInlineCandidateId(OpCode opCode)

{
  BuiltinFunction local_9 [5];
  OpCode opCode_local;
  
  switch(opCode) {
  case InlineMathAcos:
    BuiltinFunction::BuiltinFunction(local_9,Math_Acos);
    break;
  case InlineMathAsin:
    BuiltinFunction::BuiltinFunction(local_9,Math_Asin);
    break;
  case InlineMathAtan:
    BuiltinFunction::BuiltinFunction(local_9,Math_Atan);
    break;
  case InlineMathAtan2:
    BuiltinFunction::BuiltinFunction(local_9,Math_Atan2);
    break;
  case InlineMathCos:
    BuiltinFunction::BuiltinFunction(local_9,Math_Cos);
    break;
  case InlineMathExp:
    BuiltinFunction::BuiltinFunction(local_9,Math_Exp);
    break;
  case InlineMathLog:
    BuiltinFunction::BuiltinFunction(local_9,Math_Log);
    break;
  case InlineMathPow:
    BuiltinFunction::BuiltinFunction(local_9,Math_Pow);
    break;
  case InlineMathSin:
    BuiltinFunction::BuiltinFunction(local_9,Math_Sin);
    break;
  case InlineMathSqrt:
    BuiltinFunction::BuiltinFunction(local_9,Math_Sqrt);
    break;
  case InlineMathTan:
    BuiltinFunction::BuiltinFunction(local_9,Math_Tan);
    break;
  case InlineMathAbs:
    BuiltinFunction::BuiltinFunction(local_9,Math_Abs);
    break;
  case InlineMathClz:
    BuiltinFunction::BuiltinFunction(local_9,Math_Clz32);
    break;
  default:
    BuiltinFunction::BuiltinFunction(local_9,None);
    break;
  case InlineMathCeil:
    BuiltinFunction::BuiltinFunction(local_9,Math_Ceil);
    break;
  case InlineMathFloor:
    BuiltinFunction::BuiltinFunction(local_9,Math_Floor);
    break;
  case InlineMathMax:
    BuiltinFunction::BuiltinFunction(local_9,Math_Max);
    break;
  case InlineMathImul:
    BuiltinFunction::BuiltinFunction(local_9,Math_Imul);
    break;
  case InlineMathMin:
    BuiltinFunction::BuiltinFunction(local_9,Math_Min);
    break;
  case InlineMathRandom:
    BuiltinFunction::BuiltinFunction(local_9,Math_Random);
    break;
  case InlineMathRound:
    BuiltinFunction::BuiltinFunction(local_9,Math_Round);
    break;
  case InlineMathFround:
    BuiltinFunction::BuiltinFunction(local_9,Math_Fround);
    break;
  case InlineStringCharAt:
    BuiltinFunction::BuiltinFunction(local_9,JavascriptString_CharAt);
    break;
  case InlineStringCharCodeAt:
    BuiltinFunction::BuiltinFunction(local_9,JavascriptString_CharCodeAt);
    break;
  case InlineStringCodePointAt:
    BuiltinFunction::BuiltinFunction(local_9,JavascriptString_CodePointAt);
    break;
  case InlineArrayPop:
    BuiltinFunction::BuiltinFunction(local_9,JavascriptArray_Pop);
    break;
  case InlineArrayPush:
    BuiltinFunction::BuiltinFunction(local_9,JavascriptArray_Push);
    break;
  case InlineFunctionApply:
    BuiltinFunction::BuiltinFunction(local_9,JavascriptFunction_Apply);
    break;
  case InlineFunctionCall:
    BuiltinFunction::BuiltinFunction(local_9,JavascriptFunction_Call);
    break;
  case InlineRegExpExec:
    BuiltinFunction::BuiltinFunction(local_9,JavascriptRegExp_Exec);
  }
  return (BuiltinFunction)local_9[0]._value;
}

Assistant:

BuiltinFunction JavascriptLibrary::GetBuiltInInlineCandidateId(OpCode opCode)
    {
        switch (opCode)
        {
        case OpCode::InlineMathAcos:
            return BuiltinFunction::Math_Acos;

        case OpCode::InlineMathAsin:
            return BuiltinFunction::Math_Asin;

        case OpCode::InlineMathAtan:
            return BuiltinFunction::Math_Atan;

        case OpCode::InlineMathAtan2:
            return BuiltinFunction::Math_Atan2;

        case OpCode::InlineMathCos:
            return BuiltinFunction::Math_Cos;

        case OpCode::InlineMathExp:
            return BuiltinFunction::Math_Exp;

        case OpCode::InlineMathLog:
            return BuiltinFunction::Math_Log;

        case OpCode::InlineMathPow:
            return BuiltinFunction::Math_Pow;

        case OpCode::InlineMathSin:
            return BuiltinFunction::Math_Sin;

        case OpCode::InlineMathSqrt:
            return BuiltinFunction::Math_Sqrt;

        case OpCode::InlineMathTan:
            return BuiltinFunction::Math_Tan;

        case OpCode::InlineMathAbs:
            return BuiltinFunction::Math_Abs;

        case OpCode::InlineMathClz:
            return BuiltinFunction::Math_Clz32;

        case OpCode::InlineMathCeil:
            return BuiltinFunction::Math_Ceil;

        case OpCode::InlineMathFloor:
            return BuiltinFunction::Math_Floor;

        case OpCode::InlineMathMax:
            return BuiltinFunction::Math_Max;

        case OpCode::InlineMathMin:
            return BuiltinFunction::Math_Min;

        case OpCode::InlineMathImul:
            return BuiltinFunction::Math_Imul;

        case OpCode::InlineMathRandom:
            return BuiltinFunction::Math_Random;

        case OpCode::InlineMathRound:
            return BuiltinFunction::Math_Round;

        case OpCode::InlineMathFround:
            return BuiltinFunction::Math_Fround;

        case OpCode::InlineStringCharAt:
            return BuiltinFunction::JavascriptString_CharAt;

        case OpCode::InlineStringCharCodeAt:
            return BuiltinFunction::JavascriptString_CharCodeAt;

        case OpCode::InlineStringCodePointAt:
            return BuiltinFunction::JavascriptString_CodePointAt;

        case OpCode::InlineArrayPop:
            return BuiltinFunction::JavascriptArray_Pop;

        case OpCode::InlineArrayPush:
            return BuiltinFunction::JavascriptArray_Push;

        case OpCode::InlineFunctionApply:
            return BuiltinFunction::JavascriptFunction_Apply;

        case OpCode::InlineFunctionCall:
            return BuiltinFunction::JavascriptFunction_Call;

        case OpCode::InlineRegExpExec:
            return BuiltinFunction::JavascriptRegExp_Exec;
        }

        return BuiltinFunction::None;
    }